

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

bool __thiscall
presolve::HighsPostsolveStack::duplicateColumn
          (HighsPostsolveStack *this,double colScale,double colLower,double colUpper,
          double duplicateColLower,double duplicateColUpper,HighsInt col,HighsInt duplicateCol,
          bool colIntegral,bool duplicateColIntegral,double ok_merge_tolerance)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  HighsPostsolveStack *in_XMM0_Qa;
  bool prevent_illegal_merge;
  bool ok_merge;
  DuplicateColumn debug_values;
  HighsInt origDuplicateCol;
  HighsInt origCol;
  undefined6 in_stack_ffffffffffffff68;
  ReductionType type;
  
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)in_ESI);
  iVar1 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)in_EDX);
  iVar2 = *pvVar4;
  bVar3 = DuplicateColumn::okMerge
                    ((DuplicateColumn *)debug_values.duplicateColLower,debug_values.colUpper);
  if (bVar3) {
    type = bVar3;
    HighsDataStack::push<presolve::HighsPostsolveStack::DuplicateColumn,_0>
              ((HighsDataStack *)in_XMM0_Qa,
               (DuplicateColumn *)CONCAT17(bVar3,CONCAT16(1,in_stack_ffffffffffffff68)));
    reductionAdded(in_XMM0_Qa,type);
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x90),
                        (long)iVar1);
    *pvVar5 = '\0';
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x90),
                        (long)iVar2);
    *pvVar5 = '\0';
  }
  return bVar3;
}

Assistant:

bool duplicateColumn(double colScale, double colLower, double colUpper,
                       double duplicateColLower, double duplicateColUpper,
                       HighsInt col, HighsInt duplicateCol, bool colIntegral,
                       bool duplicateColIntegral,
                       const double ok_merge_tolerance) {
    const HighsInt origCol = origColIndex[col];
    const HighsInt origDuplicateCol = origColIndex[duplicateCol];
    DuplicateColumn debug_values = {
        colScale,          colLower,          colUpper,
        duplicateColLower, duplicateColUpper, origCol,
        origDuplicateCol,  colIntegral,       duplicateColIntegral};
    const bool ok_merge = debug_values.okMerge(ok_merge_tolerance);
    const bool prevent_illegal_merge = true;
    if (!ok_merge && prevent_illegal_merge) return false;
    reductionValues.push(debug_values);
    //    reductionValues.push(DuplicateColumn{
    //        colScale, colLower, colUpper, duplicateColLower,
    //        duplicateColUpper, origCol, origDuplicateCol, colIntegral,
    //        duplicateColIntegral});

    reductionAdded(ReductionType::kDuplicateColumn);

    // mark columns as not linearly transformable
    linearlyTransformable[origCol] = false;
    linearlyTransformable[origDuplicateCol] = false;
    return true;
  }